

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

int Ppmd8_DecodeSymbol(CPpmd8 *p)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  Byte *pBVar5;
  CPpmd_State *pCVar6;
  UInt16 UVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  CPpmd8_Context *pCVar11;
  CPpmd_See *pCVar12;
  long *plVar13;
  UInt32 UVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  UInt16 *pUVar19;
  byte *pbVar20;
  byte *pbVar21;
  size_t charMask [32];
  CPpmd_State *ps [256];
  UInt32 local_93c;
  char local_938 [256];
  long local_838 [257];
  
  pCVar11 = p->MinContext;
  uVar18 = (uint)pCVar11->NumStats;
  if (pCVar11->NumStats == 0) {
    pUVar19 = p->BinSumm[p->NS2Indx[(ulong)*(byte *)((long)&pCVar11->SummFreq + 1) - 1]] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) + (uint)pCVar11->Flags +
              (uint)p->NS2BSIndx[p->Base[pCVar11->Suffix]] + p->PrevSuccess);
    uVar18 = p->Range >> 0xe;
    p->Range = uVar18;
    uVar4 = *pUVar19;
    if (p->Code / uVar18 < (uint)uVar4) {
      RangeDec_Decode(p,0,(uint)uVar4);
      *pUVar19 = (*pUVar19 - (short)(*pUVar19 + 0x20 >> 7)) + 0x80;
      pCVar11 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar11->SummFreq;
      UVar7 = pCVar11->SummFreq;
      bVar1 = *(byte *)((long)&pCVar11->SummFreq + 1);
      *(byte *)((long)&pCVar11->SummFreq + 1) = bVar1 + (bVar1 < 0xc4);
      p->PrevSuccess = 1;
      p->RunLength = p->RunLength + 1;
      NextContext(p);
      return (uint)(byte)UVar7;
    }
    RangeDec_Decode(p,(uint)uVar4,0x4000 - uVar4);
    uVar18 = (uint)*pUVar19 - (*pUVar19 + 0x20 >> 7);
    *pUVar19 = (ushort)uVar18;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar18 & 0xffff) >> 10];
    memset(local_938,0xff,0x100);
    pCVar11 = p->MinContext;
    local_938[(byte)pCVar11->SummFreq] = '\0';
    p->PrevSuccess = 0;
  }
  else {
    pBVar5 = p->Base;
    uVar17 = (ulong)pCVar11->Stats;
    uVar4 = pCVar11->SummFreq;
    uVar15 = (ulong)p->Range / (ulong)uVar4;
    p->Range = (UInt32)uVar15;
    bVar1 = pBVar5[uVar17 + 1];
    uVar8 = (uint)(p->Code / uVar15);
    if (uVar8 < bVar1) {
      RangeDec_Decode(p,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar5 + uVar17);
      bVar1 = ((CPpmd_State *)(pBVar5 + uVar17))->Symbol;
      Ppmd8_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    pbVar21 = pBVar5 + (uVar17 - 6);
    uVar16 = (uint)bVar1;
    do {
      pbVar20 = pbVar21;
      UVar14 = uVar16 + pbVar20[0xd];
      if (uVar8 < UVar14) {
        RangeDec_Decode(p,uVar16,(uint)pbVar20[0xd]);
        p->FoundState = (CPpmd_State *)(pbVar20 + 0xc);
        bVar1 = pbVar20[0xc];
        Ppmd8_Update1(p);
        return (uint)bVar1;
      }
      pbVar21 = pbVar20 + 6;
      uVar18 = uVar18 - 1;
      uVar16 = UVar14;
    } while (uVar18 != 0);
    if (uVar4 <= uVar8) {
      return -2;
    }
    RangeDec_Decode(p,UVar14,uVar4 - UVar14);
    memset(local_938,0xff,0x100);
    local_938[pbVar20[0xc]] = '\0';
    pCVar11 = p->MinContext;
    uVar18 = (uint)pCVar11->NumStats;
    do {
      local_938[*pbVar21] = '\0';
      pbVar21 = pbVar21 + -6;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  while( true ) {
    bVar1 = pCVar11->NumStats;
    uVar18 = p->OrderFall;
    do {
      uVar15 = (ulong)pCVar11->Suffix;
      if (uVar15 == 0) {
        p->OrderFall = uVar18 + 1;
        return -1;
      }
      pBVar5 = p->Base;
      pCVar11 = (CPpmd8_Context *)(pBVar5 + uVar15);
      p->MinContext = pCVar11;
      bVar2 = pBVar5[uVar15];
      uVar18 = uVar18 + 1;
    } while (bVar2 == bVar1);
    p->OrderFall = uVar18;
    pbVar21 = pBVar5 + pCVar11->Stats;
    uVar8 = (uint)bVar1;
    uVar18 = 0;
    uVar15 = 0;
    do {
      cVar3 = local_938[*pbVar21];
      uVar18 = uVar18 + ((uint)pbVar21[1] & (int)cVar3);
      local_838[uVar15] = (long)pbVar21;
      pbVar21 = pbVar21 + 6;
      uVar16 = (int)uVar15 - (int)cVar3;
      uVar15 = (ulong)uVar16;
    } while (uVar16 != bVar2 - uVar8);
    pCVar12 = Ppmd8_MakeEscFreq(p,uVar8,&local_93c);
    uVar16 = local_93c + uVar18;
    uVar15 = (ulong)p->Range / (ulong)uVar16;
    p->Range = (UInt32)uVar15;
    uVar9 = (uint)(p->Code / uVar15);
    if (uVar9 < uVar18) break;
    if (uVar16 <= uVar9) {
      return -2;
    }
    RangeDec_Decode(p,uVar18,local_93c);
    pCVar12->Summ = pCVar12->Summ + (short)uVar16;
    iVar10 = uVar8 - bVar2;
    plVar13 = local_838 + (~uVar8 + (uint)bVar2);
    do {
      local_938[*(byte *)*plVar13] = '\0';
      plVar13 = plVar13 + -1;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    pCVar11 = p->MinContext;
  }
  plVar13 = local_838;
  uVar18 = 0;
  do {
    UVar14 = uVar18;
    pCVar6 = (CPpmd_State *)*plVar13;
    uVar18 = UVar14 + pCVar6->Freq;
    plVar13 = plVar13 + 1;
  } while (uVar18 <= uVar9);
  RangeDec_Decode(p,UVar14,(uint)pCVar6->Freq);
  bVar1 = pCVar12->Shift;
  if (bVar1 < 7) {
    pBVar5 = &pCVar12->Count;
    *pBVar5 = *pBVar5 + 0xff;
    if (*pBVar5 == '\0') {
      pCVar12->Summ = pCVar12->Summ << 1;
      pCVar12->Shift = bVar1 + 1;
      pCVar12->Count = (Byte)(3 << (bVar1 & 0x1f));
    }
  }
  p->FoundState = pCVar6;
  bVar1 = pCVar6->Symbol;
  Ppmd8_Update2(p);
  return (uint)bVar1;
}

Assistant:

int Ppmd8_DecodeSymbol(CPpmd8 *p)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 0)
  {
    CPpmd_State *s = Ppmd8_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = RangeDec_GetThreshold(p, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd8_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    RangeDec_Decode(p, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd8_GetBinSumm(p);
    if (((p->Code / (p->Range >>= 14)) < *prob))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd8Context_OneState(p->MinContext))->Symbol;
      Ppmd8_UpdateBin(p);
      return symbol;
    }
    RangeDec_Decode(p, *prob, (1 << 14) - *prob);
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD8_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd8Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd8_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd8_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd8_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = RangeDec_GetThreshold(p, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    RangeDec_Decode(p, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}